

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O0

void __thiscall
dd::ProcessThreadImpl::RegisterModule(ProcessThreadImpl *this,Module *module,Location *from)

{
  bool bVar1;
  pointer pPVar2;
  ModuleCallback local_50;
  AutoLock local_28;
  AutoLock l;
  Location *from_local;
  Module *module_local;
  ProcessThreadImpl *this_local;
  
  l._lock = (Lock *)from;
  bVar1 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (!bVar1) {
    __assert_fail("_thread_checker.IsCurrent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x6c,
                  "virtual void dd::ProcessThreadImpl::RegisterModule(Module *, const Location &)");
  }
  pPVar2 = std::unique_ptr<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>::get
                     (&this->_thread);
  if (pPVar2 != (pointer)0x0) {
    (*module->_vptr_Module[2])(module,this);
  }
  AutoLock::AutoLock(&local_28,&this->_lock);
  ModuleCallback::ModuleCallback(&local_50,module,(Location *)l._lock);
  std::__cxx11::
  list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ::push_back(&this->_modules,&local_50);
  AutoLock::~AutoLock(&local_28);
  Event::Set(&this->_wake_up);
  return;
}

Assistant:

void ProcessThreadImpl::RegisterModule(Module* module, const Location& from) {
		assert(_thread_checker.IsCurrent());
		if (_thread.get())
			module->ProcessThreadAttached(this);
		{
			AutoLock l(_lock);
			_modules.push_back(ModuleCallback(module, from));
		}
		_wake_up.Set();
	}